

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# two_level_iterator.cc
# Opt level: O2

Status __thiscall leveldb::anon_unknown_7::TwoLevelIterator::status(TwoLevelIterator *this)

{
  Status SVar1;
  char *in_RAX;
  long in_RSI;
  long *plVar2;
  Status local_28;
  
  local_28.state_ = in_RAX;
  (**(code **)(**(long **)(in_RSI + 0x58) + 0x50))(&local_28);
  SVar1.state_ = local_28.state_;
  Status::~Status(&local_28);
  if (SVar1.state_ == (char *)0x0) {
    if (*(long **)(in_RSI + 0x78) != (long *)0x0) {
      (**(code **)(**(long **)(in_RSI + 0x78) + 0x50))(&local_28);
      Status::~Status(&local_28);
      if (local_28.state_ != (char *)0x0) {
        plVar2 = *(long **)(in_RSI + 0x78);
        goto LAB_001082f2;
      }
    }
    Status::Status((Status *)this,(Status *)(in_RSI + 0x50));
  }
  else {
    plVar2 = *(long **)(in_RSI + 0x58);
LAB_001082f2:
    (**(code **)(*plVar2 + 0x50))(this);
  }
  return (Status)(char *)this;
}

Assistant:

Status status() const override {
    // It'd be nice if status() returned a const Status& instead of a Status
    if (!index_iter_.status().ok()) {
      return index_iter_.status();
    } else if (data_iter_.iter() != nullptr && !data_iter_.status().ok()) {
      return data_iter_.status();
    } else {
      return status_;
    }
  }